

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O3

bool pstore::repo::fragment::fragment_appears_valid
               (fragment *f,extent<pstore::repo::fragment> *fext)

{
  member_array *sa;
  ulong offset;
  ulong uVar1;
  indices iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long *puVar6;
  uint64_t *puVar7;
  ulong pos;
  ulong min_offset;
  size_t size;
  byte bVar8;
  const_iterator cVar9;
  indices indices;
  indices local_54;
  const_iterator local_50;
  byte local_40;
  uint64_t *local_38;
  
  if (((*(long *)(f->signature_)._M_elems == 0x746e656d67617246) &&
      (local_54.bitmap_ = (f->arr_).sa_.bitmap_, local_54.bitmap_ != 0)) &&
     (uVar4 = sparse_array<unsigned_long,_unsigned_int>::indices::back(&local_54),
     iVar2.bitmap_ = local_54.bitmap_, (byte)uVar4 < 0x13)) {
    if ((ulong)local_54.bitmap_ != 0) {
      uVar4 = bit_count::ctz((ulong)local_54.bitmap_);
      bVar8 = (byte)uVar4 & 0x1f;
      local_50.pos_ = (size_t)uVar4;
      if (iVar2.bitmap_ >> bVar8 != 0) {
        sa = &f->arr_;
        local_38 = &fext->size;
        min_offset = 0x20;
        local_50.bitmap_ = iVar2.bitmap_ >> bVar8;
        do {
          bVar8 = (byte)local_50.pos_;
          pos = local_50.pos_ & 0xff;
          local_40 = bVar8;
          puVar6 = sparse_array<unsigned_long,unsigned_int>::
                   index_impl<pstore::sparse_array<unsigned_long,unsigned_int>const&,unsigned_long_const>
                             (&sa->sa_,pos);
          offset = *puVar6;
          uVar4 = sparse_array<unsigned_long,_unsigned_int>::indices::back(&local_54);
          puVar7 = local_38;
          if (bVar8 != (byte)uVar4) {
            cVar9 = sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator+
                              (&local_50,1);
            puVar7 = sparse_array<unsigned_long,unsigned_int>::
                     index_impl<pstore::sparse_array<unsigned_long,unsigned_int>const&,unsigned_long_const>
                               (&sa->sa_,(ulong)(byte)cVar9.pos_);
          }
          if (offset < min_offset) goto LAB_0012d6c2;
          uVar1 = *puVar7;
          size = uVar1 - offset;
          if (uVar1 < offset || size == 0) goto LAB_0012d6c2;
          if ((0x1f < bVar8) || ((1 << (bVar8 & 0x1f) & (sa->sa_).bitmap_) == 0)) {
            assert_failed("f.has_section (kind)",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                          ,0x96);
          }
          switch(pos) {
          case 0:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)0,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 1:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)1,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 2:
            if (((7 < size) && (((int)(fext->addr).a_.a_ + (int)offset & 7U) == 0)) &&
               ((size <= *local_38 && (min_offset = uVar1, offset <= *local_38 - size))))
            goto switchD_0012d7af_default;
            goto LAB_0012d6c2;
          case 3:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)3,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 4:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)4,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 5:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)5,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 6:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)6,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 7:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)7,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 8:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)8,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 9:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)9,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 10:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)10,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0xb:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)11,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0xc:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)12,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0xd:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)13,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0xe:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)14,pstore::repo::debug_line_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0xf:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)15,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0x10:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)16,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0x11:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)17,pstore::repo::generic_section>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0x12:
            min_offset = section_offset_is_valid<(pstore::repo::section_kind)18,pstore::repo::linked_definitions>
                                   (f,fext,min_offset,offset,size);
            break;
          case 0x13:
            assert_failed("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/fragment.cpp"
                          ,0x9f);
          default:
            goto switchD_0012d7af_default;
          }
          if (min_offset == 0) goto LAB_0012d6c2;
switchD_0012d7af_default:
          uVar4 = local_50.bitmap_ >> 1;
          local_50.pos_ = local_50.pos_ + 1;
          if (1 < local_50.bitmap_) {
            local_50.bitmap_ = uVar4;
            uVar5 = bit_count::ctz((ulong)uVar4);
            uVar4 = local_50.bitmap_ >> ((byte)uVar5 & 0x1f);
            local_50.pos_ = uVar5 + local_50.pos_;
          }
          local_50.bitmap_ = uVar4;
        } while (uVar4 != 0);
      }
    }
    bVar3 = true;
  }
  else {
LAB_0012d6c2:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool fragment::fragment_appears_valid (fragment const & f, pstore::extent<fragment> const & fext) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    if (f.signature_ != fragment_signature_) {
        return false;
    }
#endif // PSTORE_SIGNATURE_CHECKS_ENABLED

    auto const indices = f.arr_.get_indices ();
    if (indices.empty () || indices.back () >= section_kind::last) {
        return false;
    }

    std::uint64_t offset = sizeof (fragment);
    for (auto index_it = std::begin (indices), index_end = std::end (indices);
         index_it != index_end; ++index_it) {
        section_kind const index = *index_it;

        auto const this_offset = f.arr_[index];
        auto const next_offset = (index == indices.back ()) ? fext.size : f.arr_[*(index_it + 1)];
        if (this_offset < offset || next_offset <= this_offset) {
            return false;
        }

        section_kind const kind = static_cast<section_kind> (index);
        PSTORE_ASSERT (f.has_section (kind));
#define X(k)                                                                                       \
    case section_kind::k:                                                                          \
        offset = fragment::section_offset_is_valid<section_kind::k> (f, fext, offset, this_offset, \
                                                                     next_offset - this_offset);   \
        break;

        switch (kind) {
            PSTORE_MCREPO_SECTION_KINDS
        case repo::section_kind::last: PSTORE_ASSERT (false); break;
        }
#undef X
        if (offset == 0) {
            return false;
        }
    }

    return true;
}